

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::SyntaxRewriter<InterleavedRewriter>::parse
          (SyntaxRewriter<InterleavedRewriter> *this,string_view text)

{
  SourceManager *pSVar1;
  string_view path;
  string_view name;
  string_view text_00;
  shared_ptr<slang::syntax::SyntaxTree> local_78;
  size_t local_68;
  char *pcStack_60;
  undefined1 local_58 [32];
  pointer local_38;
  pointer ppStack_30;
  
  text_00._M_str = (char *)text._M_len;
  pSVar1 = this->sourceManager;
  local_68 = 0;
  pcStack_60 = "";
  local_38 = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)local_58);
  path._M_str = pcStack_60;
  path._M_len = local_68;
  name._M_str = (char *)0x6;
  name._M_len = (size_t)pSVar1;
  text_00._M_len = (size_t)&local_78;
  SyntaxTree::fromText
            (text_00,(SourceManager *)text._M_str,name,path,(Bag *)0x8bf275,
             (SourceLibrary *)local_58);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
            ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
              *)&this->tempTrees,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)local_58);
  return ((this->tempTrees).
          super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         rootNode;
}

Assistant:

SyntaxNode& parse(std::string_view text) {
        tempTrees.emplace_back(SyntaxTree::fromText(text, *sourceManager));
        return tempTrees.back()->root();
    }